

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateParsingConstructor
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  int iVar1;
  FieldGenerator *pFVar2;
  FieldDescriptor **ppFVar3;
  ulong uVar4;
  ulong extraout_RDX;
  int iVar5;
  char *__s;
  uint uVar6;
  int i_2;
  java *this_00;
  int i_1;
  long lVar7;
  int i;
  long lVar8;
  allocator<char> local_69;
  MessageGenerator *local_68;
  FieldGeneratorMap *local_60;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  string local_50;
  
  sorted_fields.array_ = anon_unknown_5::SortFieldsByNumber(this->descriptor_);
  local_68 = this;
  google::protobuf::io::Printer::Print
            ((char *)printer,
             "private $classname$(\n    com.google.protobuf.CodedInputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n"
             ,(string *)"classname");
  google::protobuf::io::Printer::Indent();
  google::protobuf::io::Printer::Print((char *)printer);
  local_60 = &local_68->field_generators_;
  lVar7 = 0;
  iVar5 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(local_68->descriptor_ + 0x2c); lVar8 = lVar8 + 1) {
    pFVar2 = FieldGeneratorMap::get
                       (local_60,(FieldDescriptor *)
                                 (*(long *)(local_68->descriptor_ + 0x30) + lVar7));
    iVar1 = (*pFVar2->_vptr_FieldGenerator[3])(pFVar2);
    iVar5 = iVar5 + iVar1;
    lVar7 = lVar7 + 0x78;
  }
  iVar1 = (iVar5 + 0x1f) / 0x20;
  uVar4 = (long)(iVar5 + 0x1f) % 0x20 & 0xffffffff;
  this_00 = (java *)0x0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (; iVar1 != (int)this_00; this_00 = (java *)(ulong)((int)this_00 + 1)) {
    GetBitFieldName_abi_cxx11_(&local_50,this_00,(int)uVar4);
    google::protobuf::io::Printer::Print
              ((char *)printer,"int mutable_$bit_field_name$ = 0;\n",(string *)"bit_field_name");
    std::__cxx11::string::~string((string *)&local_50);
    uVar4 = extraout_RDX;
  }
  if (*(int *)(*(long *)(*(long *)(local_68->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    google::protobuf::io::Printer::Print((char *)printer);
  }
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Indent();
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Indent();
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Indent();
  __s = " unknownFields,";
  if (*(int *)(*(long *)(*(long *)(local_68->descriptor_ + 0x10) + 0x88) + 0x50) == 3) {
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_69);
  google::protobuf::io::Printer::Print
            ((char *)printer,
             "case 0:\n  done = true;\n  break;\ndefault: {\n  if (!parseUnknownField(input,$unknown_fields$\n                         extensionRegistry, tag)) {\n    done = true;\n  }\n  break;\n}\n"
             ,(string *)0x17c291);
  std::__cxx11::string::~string((string *)&local_50);
  for (lVar7 = 0; lVar7 < *(int *)(local_68->descriptor_ + 0x2c); lVar7 = lVar7 + 1) {
    ppFVar3 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        (&sorted_fields,lVar7);
    field = *ppFVar3;
    uVar6 = (uint)&local_50;
    google::protobuf::SimpleItoa_abi_cxx11_(uVar6);
    google::protobuf::io::Printer::Print((char *)printer,"case $tag$: {\n",(string *)0x1722a5);
    std::__cxx11::string::~string((string *)&local_50);
    google::protobuf::io::Printer::Indent();
    pFVar2 = FieldGeneratorMap::get(local_60,field);
    (*pFVar2->_vptr_FieldGenerator[0xb])(pFVar2,printer);
    google::protobuf::io::Printer::Outdent();
    google::protobuf::io::Printer::Print((char *)printer);
    if ((*(int *)(field + 0x30) == 3) && (*(int *)(field + 0x2c) - 0xdU < 0xfffffffc)) {
      google::protobuf::SimpleItoa_abi_cxx11_(uVar6);
      google::protobuf::io::Printer::Print((char *)printer,"case $tag$: {\n",(string *)0x1722a5);
      std::__cxx11::string::~string((string *)&local_50);
      google::protobuf::io::Printer::Indent();
      pFVar2 = FieldGeneratorMap::get(local_60,field);
      (*pFVar2->_vptr_FieldGenerator[0xc])(pFVar2,printer);
      google::protobuf::io::Printer::Outdent();
      google::protobuf::io::Printer::Print((char *)printer);
    }
  }
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Indent();
  for (lVar7 = 0; lVar7 < *(int *)(local_68->descriptor_ + 0x2c); lVar7 = lVar7 + 1) {
    ppFVar3 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        (&sorted_fields,lVar7);
    pFVar2 = FieldGeneratorMap::get(local_60,*ppFVar3);
    (*pFVar2->_vptr_FieldGenerator[0xd])(pFVar2,printer);
  }
  if (*(int *)(*(long *)(*(long *)(local_68->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    google::protobuf::io::Printer::Print((char *)printer);
  }
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Print((char *)printer);
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array(&sorted_fields);
  return;
}

Assistant:

void MessageGenerator::GenerateParsingConstructor(io::Printer* printer) {
  scoped_array<const FieldDescriptor*> sorted_fields(
      SortFieldsByNumber(descriptor_));

  printer->Print(
      "private $classname$(\n"
      "    com.google.protobuf.CodedInputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n",
      "classname", descriptor_->name());
  printer->Indent();

  // Initialize all fields to default.
  printer->Print(
      "initFields();\n");

  // Use builder bits to track mutable repeated fields.
  int totalBuilderBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldGenerator& field = field_generators_.get(descriptor_->field(i));
    totalBuilderBits += field.GetNumBitsForBuilder();
  }
  int totalBuilderInts = (totalBuilderBits + 31) / 32;
  for (int i = 0; i < totalBuilderInts; i++) {
    printer->Print("int mutable_$bit_field_name$ = 0;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  if (HasUnknownFields(descriptor_)) {
    printer->Print(
      "com.google.protobuf.UnknownFieldSet.Builder unknownFields =\n"
      "    com.google.protobuf.UnknownFieldSet.newBuilder();\n");
  }

  printer->Print(
      "try {\n");
  printer->Indent();

  printer->Print(
    "boolean done = false;\n"
    "while (!done) {\n");
  printer->Indent();

  printer->Print(
    "int tag = input.readTag();\n"
    "switch (tag) {\n");
  printer->Indent();

  printer->Print(
    "case 0:\n"          // zero signals EOF / limit reached
    "  done = true;\n"
    "  break;\n"
    "default: {\n"
    "  if (!parseUnknownField(input,$unknown_fields$\n"
    "                         extensionRegistry, tag)) {\n"
    "    done = true;\n"  // it's an endgroup tag
    "  }\n"
    "  break;\n"
    "}\n",
    "unknown_fields", HasUnknownFields(descriptor_)
        ? " unknownFields," : "");

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    uint32 tag = WireFormatLite::MakeTag(field->number(),
      WireFormat::WireTypeForFieldType(field->type()));

    printer->Print(
      "case $tag$: {\n",
      "tag", SimpleItoa(tag));
    printer->Indent();

    field_generators_.get(field).GenerateParsingCode(printer);

    printer->Outdent();
    printer->Print(
      "  break;\n"
      "}\n");

    if (field->is_packable()) {
      // To make packed = true wire compatible, we generate parsing code from a
      // packed version of this field regardless of field->options().packed().
      uint32 packed_tag = WireFormatLite::MakeTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      printer->Print(
        "case $tag$: {\n",
        "tag", SimpleItoa(packed_tag));
      printer->Indent();

      field_generators_.get(field).GenerateParsingCodeFromPacked(printer);

      printer->Outdent();
      printer->Print(
        "  break;\n"
        "}\n");
    }
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // switch (tag)
      "}\n");     // while (!done)

  printer->Outdent();
  printer->Print(
      "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
      "  throw e.setUnfinishedMessage(this);\n"
      "} catch (java.io.IOException e) {\n"
      "  throw new com.google.protobuf.InvalidProtocolBufferException(\n"
      "      e.getMessage()).setUnfinishedMessage(this);\n"
      "} finally {\n");
  printer->Indent();

  // Make repeated field list immutable.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    field_generators_.get(field).GenerateParsingDoneCode(printer);
  }

  // Make unknown fields immutable.
  if (HasUnknownFields(descriptor_)) {
    printer->Print(
        "this.unknownFields = unknownFields.build();\n");
  }

  // Make extensions immutable.
  printer->Print(
      "makeExtensionsImmutable();\n");

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // finally
      "}\n");
}